

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall ON_Plane::Transform(ON_Plane *this,ON_Xform *xform)

{
  double dVar1;
  bool bVar2;
  ON_3dVector yaxis_vec;
  ON_3dVector xaxis_vec;
  ON_3dPoint origin_pt;
  ON_3dVector local_a0;
  ON_3dVector local_88;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  ON_3dPoint local_40;
  
  bVar2 = ON_Xform::IsIdentity(xform,0.0);
  if (bVar2) {
    bVar2 = IsValid(this);
    return bVar2;
  }
  ON_Xform::operator*(&local_70,xform,&this->origin);
  dVar1 = xform->m_xform[3][0];
  if (((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar1 = xform->m_xform[3][1], dVar1 != 0.0)) ||
      ((NAN(dVar1) || (dVar1 = xform->m_xform[3][2], dVar1 != 0.0)))) ||
     ((NAN(dVar1) || ((dVar1 = xform->m_xform[3][3], dVar1 != 1.0 || (NAN(dVar1))))))) {
    ON_3dPoint::operator+(&local_58,&this->origin,&this->xaxis);
    ON_Xform::operator*((ON_3dPoint *)&local_a0,xform,&local_58);
    ON_3dPoint::operator-(&local_88,(ON_3dPoint *)&local_a0,&local_70);
    ON_3dPoint::operator+(&local_40,&this->origin,&this->yaxis);
    ON_Xform::operator*(&local_58,xform,&local_40);
    ON_3dPoint::operator-(&local_a0,&local_58,&local_70);
  }
  else {
    ON_Xform::operator*(&local_88,xform,&this->xaxis);
    ON_Xform::operator*(&local_a0,xform,&this->yaxis);
  }
  bVar2 = CreateFromFrame(this,&local_70,&local_88,&local_a0);
  return bVar2;
}

Assistant:

bool ON_Plane::Transform( const ON_Xform& xform )
{
  if ( xform.IsIdentity() )
  {
    // 27 October 2011 Dale Lear
    //    If the plane is valid and the transformation
    //    is the identity, then NO changes should be
    //    made to the plane's values.  In particular
    //    calling CreateFromFrame() can introduce
    //    slight fuzz.
    //
    //    Please discuss any changes with me.
    return IsValid();
  }

  ON_3dPoint origin_pt = xform*origin;

  // use care transforming vectors to get
  // maximum precision and the right answer
  bool bUseVectorXform = (    0.0 == xform.m_xform[3][0] 
                           && 0.0 == xform.m_xform[3][1]
                           && 0.0 == xform.m_xform[3][2] 
                           && 1.0 == xform.m_xform[3][3]
                         );

  ON_3dVector xaxis_vec = bUseVectorXform ? (xform*xaxis) : ((xform*(origin+xaxis)) - origin_pt);
  ON_3dVector yaxis_vec = bUseVectorXform ? (xform*yaxis) : ((xform*(origin+yaxis)) - origin_pt);

  return CreateFromFrame( origin_pt, xaxis_vec, yaxis_vec );
}